

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pn.cpp
# Opt level: O0

int __thiscall DSDcc::PN_9_5::init(PN_9_5 *this,EVP_PKEY_CTX *ctx)

{
  uint uVar1;
  uint bit4;
  uint bit0;
  int i;
  uint sr;
  uchar byte;
  PN_9_5 *this_local;
  
  uVar1 = this->m_seed;
  i = 0;
  sr = uVar1;
  while (i < 0x200) {
    if (i % 8 == 0) {
      byte = '\0';
    }
    uVar1 = sr & 1;
    sr = ((sr & 0x10) >> 4 ^ uVar1) << 8 | sr >> 1;
    this->m_bitTable[i] = (uchar)uVar1;
    byte = byte + (char)(uVar1 << (7U - (char)(i % 8) & 0x1f));
    if (i % 8 == 7) {
      this->m_byteTable[i / 8] = byte;
    }
    uVar1 = i + 1;
    i = uVar1;
  }
  return uVar1;
}

Assistant:

void PN_9_5::init()
{
    unsigned char byte;
    unsigned int sr = m_seed;

    for (int i = 0; i < 512; i++)
    {
        if (i%8  == 0)
        {
            byte = 0;
        }

        unsigned int bit0 = (sr & 1);
        unsigned int bit4 = (sr & 0x10) >> 4;
        sr >>= 1;
        sr |= (bit4 ^ bit0) << 8;

        m_bitTable[i] = bit0;
        byte += bit0 << (7 - (i%8));

        if (i%8 == 7)
        {
            m_byteTable[i/8] = byte;
        }
    }

}